

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

TypeMetaFunction * __thiscall
soul::StructuralParser::parseTypeMetaFunction(StructuralParser *this,Context *context,Op op)

{
  Expression *args_1;
  TypeMetaFunction *pTVar1;
  Op op_local;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29b537);
  args_1 = parseType(this,metaFunctionArgument);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x299119);
  pTVar1 = allocate<soul::AST::TypeMetaFunction,soul::AST::Context_const&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op&>
                     (this,context,args_1,&op_local);
  return pTVar1;
}

Assistant:

AST::TypeMetaFunction& parseTypeMetaFunction (const AST::Context& context, AST::TypeMetaFunction::Op op)
    {
        expect (Operator::openParen);
        auto& t = parseType (ParseTypeContext::metaFunctionArgument);
        expect (Operator::closeParen);
        return allocate<AST::TypeMetaFunction> (context, t, op);
    }